

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCustomDepends
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *ccs)

{
  pointer cc;
  cmCustomCommandGenerator ccg;
  cmCustomCommandGenerator local_90;
  
  cc = (ccs->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
       super__Vector_impl_data._M_start;
  if (cc != (ccs->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
    do {
      cmCustomCommandGenerator::cmCustomCommandGenerator
                (&local_90,cc,&this->ConfigurationName,(this->super_cmLocalGenerator).Makefile);
      AppendCustomDepend(this,depends,&local_90);
      cmCustomCommandGenerator::~cmCustomCommandGenerator(&local_90);
      cc = cc + 1;
    } while (cc != (ccs->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
                   _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void
cmLocalUnixMakefileGenerator3
::AppendCustomDepend(std::vector<std::string>& depends,
                     cmCustomCommandGenerator const& ccg)
{
  for(std::vector<std::string>::const_iterator d = ccg.GetDepends().begin();
      d != ccg.GetDepends().end(); ++d)
    {
    // Lookup the real name of the dependency in case it is a CMake target.
    std::string dep;
    if(this->GetRealDependency(*d, this->ConfigurationName,
                               dep))
      {
      depends.push_back(dep);
      }
    }
}